

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view.hpp
# Opt level: O1

int __thiscall
pstore::sstring_view<const_char_*>::compare<char[1]>(sstring_view<const_char_*> *this,char (*s) [1])

{
  ulong uVar1;
  bool bVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  sVar3 = strlen(*s);
  uVar1 = this->size_;
  uVar5 = uVar1;
  if (sVar3 < uVar1) {
    uVar5 = sVar3;
  }
  bVar2 = true;
  if (uVar5 == 0) {
    uVar4 = 0;
  }
  else {
    uVar6 = 0;
    uVar4 = 0;
    do {
      if (this->ptr_[uVar6] < s[uVar6][0]) {
        uVar4 = 0xffffffff;
LAB_001be534:
        bVar2 = false;
        break;
      }
      if (s[uVar6][0] < this->ptr_[uVar6]) {
        uVar4 = 1;
        goto LAB_001be534;
      }
      uVar6 = uVar6 + 1;
    } while (uVar5 != uVar6);
  }
  if ((bVar2) && (uVar4 = 0, uVar1 != sVar3)) {
    uVar4 = -(uint)(uVar1 < sVar3) | 1;
  }
  return uVar4;
}

Assistant:

int sstring_view<PointerType>::compare (StringType const & s) const {
        auto const slen = string_traits<StringType>::length (s);
        size_type const common_len = std::min (size (), slen);
        int result = traits::compare (data (), string_traits<StringType>::data (s), common_len);
        if (result == 0) {
            result = (size () == slen) ? 0 : (size () < slen ? -1 : 1);
        }
        return result;
    }